

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O0

uint64_t __thiscall
adios2::core::engine::BP5Writer::CountStepsInMetadataIndex(BP5Writer *this,BufferSTL *bufferSTL)

{
  bool bVar1;
  size_type sVar2;
  char *pcVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  reference pvVar8;
  long in_RSI;
  long in_RDI;
  size_t FirstDataPos;
  uint64_t i_1;
  uint64_t FlushCount_1;
  uint64_t MetadataPos;
  uint64_t subfileIdx;
  uint64_t i;
  uchar recordID_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> writerToFileMap;
  uint currentStep;
  int s;
  uint targetStep;
  uint64_t FlushCount;
  uchar recordID;
  uint64_t nDataFiles;
  uint availableSteps;
  string m_1;
  uint8_t NowColumnMajor;
  uint8_t columnMajor;
  uint8_t minorVersion;
  uint8_t Version;
  string m;
  bool IsLittleEndian;
  uint8_t endianness;
  size_t *position;
  vector<char,_std::allocator<char>_> *buffer;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffa68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa70;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffa78;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffa80;
  value_type *in_stack_fffffffffffffa90;
  ulong uVar9;
  undefined4 in_stack_fffffffffffffa98;
  uint in_stack_fffffffffffffa9c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaa0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaa8;
  allocator *paVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffab0;
  int iVar11;
  string *in_stack_fffffffffffffab8;
  string *message;
  string *in_stack_fffffffffffffac0;
  string *in_stack_fffffffffffffac8;
  string *source;
  undefined6 in_stack_fffffffffffffad0;
  undefined1 in_stack_fffffffffffffad6;
  undefined1 uVar12;
  undefined1 in_stack_fffffffffffffad7;
  uchar uVar13;
  ulong local_4c0;
  ulong local_4a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_490;
  uint local_474;
  unsigned_long *local_470;
  unsigned_long *local_468;
  undefined8 local_460;
  uint local_458;
  uint local_454;
  unsigned_long local_450;
  byte local_441;
  ulong local_440;
  uint local_434;
  string local_430 [32];
  string local_410 [39];
  allocator local_3e9;
  string local_3e8 [39];
  undefined1 local_3c1 [40];
  undefined1 local_399 [40];
  undefined1 local_371 [39];
  uchar local_34a;
  uchar local_349;
  string local_348 [32];
  string local_328 [32];
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [39];
  allocator local_281;
  string local_280 [39];
  allocator local_259;
  string local_258 [39];
  allocator local_231;
  string local_230 [39];
  uchar local_209;
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [39];
  allocator local_1a1;
  string local_1a0 [39];
  allocator local_179;
  string local_178 [39];
  allocator local_151;
  string local_150 [39];
  uchar local_129;
  string local_128 [32];
  string local_108 [39];
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [55];
  allocator local_59;
  string local_58 [38];
  byte local_32;
  uchar local_31;
  undefined8 local_30;
  ulong *local_28;
  vector<char,_std::allocator<char>_> *local_20;
  ulong local_8;
  
  local_20 = (vector<char,_std::allocator<char>_> *)(in_RSI + 0x40);
  local_28 = (ulong *)(in_RSI + 0x30);
  sVar2 = std::vector<char,_std::allocator<char>_>::size(local_20);
  if (sVar2 < 0x40) {
    *(undefined8 *)(in_RDI + 0xc90) = 0;
    *(undefined8 *)(in_RDI + 0xc98) = 0;
    *(undefined8 *)(in_RDI + 0xca0) = 0;
    local_30 = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffaa0,
               CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98),
               in_stack_fffffffffffffa90);
    local_8 = 0;
  }
  else {
    *local_28 = 0x24;
    local_31 = helper::ReadValue<unsigned_char>
                         ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffa70,
                          (size_t *)in_stack_fffffffffffffa68,false);
    local_32 = -(local_31 == '\0') & 1;
    bVar1 = helper::IsLittleEndian();
    if (bVar1 != (bool)(local_32 & 1)) {
      pcVar3 = "Big";
      if ((local_32 & 1) != 0) {
        pcVar3 = "Little";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_58,pcVar3,&local_59);
      std::allocator<char>::~allocator((allocator<char> *)&local_59);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_90,"Engine",&local_91);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b8,"BP5Writer",&local_b9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e0,"CountStepsInMetadataIndex",&local_e1);
      std::operator+((char *)in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffa78._M_current,(char *)in_stack_fffffffffffffa70);
      helper::Throw<std::runtime_error>
                ((string *)
                 CONCAT17(in_stack_fffffffffffffad7,
                          CONCAT16(in_stack_fffffffffffffad6,in_stack_fffffffffffffad0)),
                 in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                 (int)((ulong)in_stack_fffffffffffffab0 >> 0x20));
      std::__cxx11::string::~string(local_108);
      std::__cxx11::string::~string(local_128);
      std::__cxx11::string::~string(local_e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_e1);
      std::__cxx11::string::~string(local_b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
      std::__cxx11::string::~string(local_90);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
      std::__cxx11::string::~string(local_58);
    }
    iVar11 = (int)((ulong)in_stack_fffffffffffffab0 >> 0x20);
    *local_28 = 0x25;
    local_129 = helper::ReadValue<unsigned_char>
                          ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffa70,
                           (size_t *)in_stack_fffffffffffffa68,false);
    if (local_129 != '\x05') {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_150,"Engine",&local_151);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_178,"BP5Writer",&local_179);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1a0,"CountStepsInMetadataIndex",&local_1a1);
      std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffab8 >> 0x20));
      std::operator+((char *)in_stack_fffffffffffffa78._M_current,in_stack_fffffffffffffa70);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffa78._M_current,(char *)in_stack_fffffffffffffa70);
      helper::Throw<std::runtime_error>
                ((string *)
                 CONCAT17(in_stack_fffffffffffffad7,
                          CONCAT16(in_stack_fffffffffffffad6,in_stack_fffffffffffffad0)),
                 in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                 iVar11);
      std::__cxx11::string::~string(local_1c8);
      std::__cxx11::string::~string(local_1e8);
      std::__cxx11::string::~string(local_208);
      std::__cxx11::string::~string(local_1a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
      std::__cxx11::string::~string(local_178);
      std::allocator<char>::~allocator((allocator<char> *)&local_179);
      std::__cxx11::string::~string(local_150);
      std::allocator<char>::~allocator((allocator<char> *)&local_151);
    }
    *local_28 = 0x26;
    local_209 = helper::ReadValue<unsigned_char>
                          ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffa70,
                           (size_t *)in_stack_fffffffffffffa68,false);
    if (local_209 != '\x02') {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_230,"Engine",&local_231);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_258,"BP5Writer",&local_259);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_280,"CountStepsInMetadataIndex",&local_281);
      std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffab8 >> 0x20));
      std::operator+((char *)in_stack_fffffffffffffa78._M_current,in_stack_fffffffffffffa70);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffa78._M_current,(char *)in_stack_fffffffffffffa70);
      std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffab8 >> 0x20));
      std::operator+(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffa78._M_current,(char *)in_stack_fffffffffffffa70);
      helper::Throw<std::runtime_error>
                ((string *)
                 CONCAT17(in_stack_fffffffffffffad7,
                          CONCAT16(in_stack_fffffffffffffad6,in_stack_fffffffffffffad0)),
                 in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                 iVar11);
      std::__cxx11::string::~string(local_2a8);
      std::__cxx11::string::~string(local_2c8);
      std::__cxx11::string::~string(local_348);
      std::__cxx11::string::~string(local_2e8);
      std::__cxx11::string::~string(local_308);
      std::__cxx11::string::~string(local_328);
      std::__cxx11::string::~string(local_280);
      std::allocator<char>::~allocator((allocator<char> *)&local_281);
      std::__cxx11::string::~string(local_258);
      std::allocator<char>::~allocator((allocator<char> *)&local_259);
      std::__cxx11::string::~string(local_230);
      std::allocator<char>::~allocator((allocator<char> *)&local_231);
    }
    *local_28 = 0x28;
    local_349 = helper::ReadValue<unsigned_char>
                          ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffa70,
                           (size_t *)in_stack_fffffffffffffa68,false);
    uVar12 = 0x6e;
    uVar13 = 'y';
    if (*(int *)(*(long *)(in_RDI + 0x28) + 0x58) != 1) {
      uVar13 = 'n';
    }
    local_34a = uVar13;
    if (local_349 != uVar13) {
      pcVar3 = "row";
      if (local_349 == 'y') {
        pcVar3 = "column";
      }
      source = (string *)local_371;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_371 + 1),pcVar3,(allocator *)source);
      std::allocator<char>::~allocator((allocator<char> *)local_371);
      message = (string *)local_399;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_399 + 1),"Engine",(allocator *)message);
      pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_3c1 + 1),"BP5Writer",(allocator *)pbVar7);
      paVar10 = &local_3e9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3e8,"CountStepsInMetadataIndex",paVar10);
      std::operator+((char *)message,pbVar7);
      iVar11 = (int)((ulong)pbVar7 >> 0x20);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffa78._M_current,(char *)in_stack_fffffffffffffa70);
      helper::Throw<std::runtime_error>
                ((string *)CONCAT17(uVar13,CONCAT16(uVar12,in_stack_fffffffffffffad0)),source,
                 (string *)pcVar3,message,iVar11);
      std::__cxx11::string::~string(local_410);
      std::__cxx11::string::~string(local_430);
      std::__cxx11::string::~string(local_3e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
      std::__cxx11::string::~string((string *)(local_3c1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_3c1);
      std::__cxx11::string::~string((string *)(local_399 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_399);
      std::__cxx11::string::~string((string *)(local_371 + 1));
    }
    *local_28 = 0x40;
    local_434 = 0;
    local_440 = 0;
    while( true ) {
      this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)*local_28;
      pvVar4 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               std::vector<char,_std::allocator<char>_>::size(local_20);
      if (pvVar4 <= this_00) break;
      local_441 = helper::ReadValue<unsigned_char>
                            ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffa70,
                             (size_t *)in_stack_fffffffffffffa68,false);
      *local_28 = *local_28 + 8;
      in_stack_fffffffffffffa9c = (uint)local_441;
      bVar1 = SUB81((ulong)in_stack_fffffffffffffa70 >> 0x38,0);
      if (in_stack_fffffffffffffa9c == 0x73) {
        *local_28 = *local_28 + 0x10;
        local_450 = helper::ReadValue<unsigned_long>
                              ((vector<char,_std::allocator<char>_> *)
                               in_stack_fffffffffffffa80._M_current,
                               in_stack_fffffffffffffa78._M_current,bVar1);
        *local_28 = (ulong)*(uint *)(in_RDI + 0xca8) * 8 * (local_450 * 2 + 1) + *local_28;
        local_434 = local_434 + 1;
      }
      else if (in_stack_fffffffffffffa9c == 0x77) {
        uVar5 = helper::ReadValue<unsigned_long>
                          ((vector<char,_std::allocator<char>_> *)
                           in_stack_fffffffffffffa80._M_current,in_stack_fffffffffffffa78._M_current
                           ,bVar1);
        *(int *)(in_RDI + 0xca8) = (int)uVar5;
        uVar5 = helper::ReadValue<unsigned_long>
                          ((vector<char,_std::allocator<char>_> *)
                           in_stack_fffffffffffffa80._M_current,in_stack_fffffffffffffa78._M_current
                           ,SUB81((ulong)in_stack_fffffffffffffa70 >> 0x38,0));
        *(int *)(in_RDI + 0xcac) = (int)uVar5;
        uVar5 = helper::ReadValue<unsigned_long>
                          ((vector<char,_std::allocator<char>_> *)
                           in_stack_fffffffffffffa80._M_current,in_stack_fffffffffffffa78._M_current
                           ,SUB81((ulong)in_stack_fffffffffffffa70 >> 0x38,0));
        *(int *)(in_RDI + 0xcb0) = (int)uVar5;
        if (local_440 < *(uint *)(in_RDI + 0xcb0)) {
          local_440 = (ulong)*(uint *)(in_RDI + 0xcb0);
        }
        *local_28 = (ulong)*(uint *)(in_RDI + 0xca8) * 8 + *local_28;
      }
    }
    if (*(int *)(in_RDI + 0x1ec) < 0) {
      local_458 = local_434 + *(int *)(in_RDI + 0x1ec) + 1;
      if ((int)local_458 < 0) {
        local_458 = 0;
      }
      local_454 = local_458;
    }
    else {
      local_454 = *(uint *)(in_RDI + 0x1ec);
    }
    if (local_434 < local_454) {
      local_454 = local_434;
    }
    local_460 = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (this_00,CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98),
               in_stack_fffffffffffffa90);
    if (local_454 == 0) {
      *(undefined8 *)(in_RDI + 0xc90) = 0;
      *(undefined8 *)(in_RDI + 0xc98) = 0;
      *(undefined8 *)(in_RDI + 0xca0) = 0;
      local_8 = 0;
    }
    else {
      *(undefined8 *)(in_RDI + 0xc90) = 0xffffffffffffffff;
      *(undefined8 *)(in_RDI + 0xc98) = 0xffffffffffffffff;
      *(undefined8 *)(in_RDI + 0xca0) = 0xffffffffffffffff;
      local_468 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                            (in_stack_fffffffffffffa68);
      local_470 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                            (in_stack_fffffffffffffa68);
      std::
      fill<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                (in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                 (unsigned_long *)in_stack_fffffffffffffa70);
      if (local_454 == local_434) {
        local_8 = (ulong)local_454;
      }
      else {
        *local_28 = 0x40;
        local_474 = 0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xa8e1f7);
        while( true ) {
          bVar1 = false;
          if (local_474 <= local_454) {
            uVar9 = *local_28;
            sVar2 = std::vector<char,_std::allocator<char>_>::size(local_20);
            bVar1 = uVar9 < sVar2;
          }
          if (!bVar1) break;
          uVar13 = helper::ReadValue<unsigned_char>
                             ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffa70,
                              (size_t *)in_stack_fffffffffffffa68,false);
          *local_28 = *local_28 + 8;
          bVar1 = SUB81((ulong)in_stack_fffffffffffffa70 >> 0x38,0);
          if (uVar13 == 's') {
            *(ulong *)(in_RDI + 0xca0) = *local_28 - 9;
            uVar5 = helper::ReadValue<unsigned_long>
                              ((vector<char,_std::allocator<char>_> *)
                               in_stack_fffffffffffffa80._M_current,
                               in_stack_fffffffffffffa78._M_current,bVar1);
            *local_28 = *local_28 + 8;
            uVar6 = helper::ReadValue<unsigned_long>
                              ((vector<char,_std::allocator<char>_> *)
                               in_stack_fffffffffffffa80._M_current,
                               in_stack_fffffffffffffa78._M_current,
                               SUB81((ulong)in_stack_fffffffffffffa70 >> 0x38,0));
            *(unsigned_long *)(in_RDI + 0xc90) = uVar5;
            if (local_474 == local_454) {
              for (local_4c0 = 0; local_4c0 < *(uint *)(in_RDI + 0xca8); local_4c0 = local_4c0 + 1)
              {
                pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         helper::ReadValue<unsigned_long>
                                   ((vector<char,_std::allocator<char>_> *)
                                    in_stack_fffffffffffffa80._M_current,
                                    in_stack_fffffffffffffa78._M_current,
                                    SUB81((ulong)in_stack_fffffffffffffa70 >> 0x38,0));
                *local_28 = uVar6 * 0x10 + *local_28;
                in_stack_fffffffffffffa78._M_current = (unsigned_long *)(in_RDI + 0xc78);
                in_stack_fffffffffffffa80._M_current = (unsigned_long *)pbVar7;
                pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   (&local_490,local_4c0);
                pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                    in_stack_fffffffffffffa78._M_current,*pvVar8);
                if (in_stack_fffffffffffffa80._M_current <
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*pvVar8) {
                  in_stack_fffffffffffffa68 =
                       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0xc78);
                  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                     (&local_490,local_4c0);
                  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                     (in_stack_fffffffffffffa68,*pvVar8);
                  *pvVar8 = (value_type)pbVar7;
                  in_stack_fffffffffffffa70 = pbVar7;
                }
              }
            }
            else {
              *local_28 = (ulong)*(uint *)(in_RDI + 0xca8) * 8 * (uVar6 * 2 + 1) + *local_28;
            }
            local_474 = local_474 + 1;
          }
          else if (uVar13 == 'w') {
            uVar5 = helper::ReadValue<unsigned_long>
                              ((vector<char,_std::allocator<char>_> *)
                               in_stack_fffffffffffffa80._M_current,
                               in_stack_fffffffffffffa78._M_current,bVar1);
            *(int *)(in_RDI + 0xca8) = (int)uVar5;
            uVar5 = helper::ReadValue<unsigned_long>
                              ((vector<char,_std::allocator<char>_> *)
                               in_stack_fffffffffffffa80._M_current,
                               in_stack_fffffffffffffa78._M_current,
                               SUB81((ulong)in_stack_fffffffffffffa70 >> 0x38,0));
            *(int *)(in_RDI + 0xcac) = (int)uVar5;
            uVar5 = helper::ReadValue<unsigned_long>
                              ((vector<char,_std::allocator<char>_> *)
                               in_stack_fffffffffffffa80._M_current,
                               in_stack_fffffffffffffa78._M_current,
                               SUB81((ulong)in_stack_fffffffffffffa70 >> 0x38,0));
            *(int *)(in_RDI + 0xcb0) = (int)uVar5;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xa8e34b);
            for (local_4a0 = 0; local_4a0 < *(uint *)(in_RDI + 0xca8); local_4a0 = local_4a0 + 1) {
              helper::ReadValue<unsigned_long>
                        ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffa80._M_current
                         ,in_stack_fffffffffffffa78._M_current,
                         SUB81((ulong)in_stack_fffffffffffffa70 >> 0x38,0));
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_fffffffffffffa80._M_current,in_stack_fffffffffffffa78._M_current);
            }
          }
        }
        local_8 = (ulong)local_454;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffa80._M_current);
      }
    }
  }
  return local_8;
}

Assistant:

uint64_t BP5Writer::CountStepsInMetadataIndex(format::BufferSTL &bufferSTL)
{
    const auto &buffer = bufferSTL.m_Buffer;
    size_t &position = bufferSTL.m_Position;

    if (buffer.size() < m_IndexHeaderSize)
    {
        m_AppendMetadataPos = 0;
        m_AppendMetaMetadataPos = 0;
        m_AppendMetadataIndexPos = 0;
        m_AppendDataPos.resize(m_Aggregator->m_NumAggregators,
                               0ULL); // safe bet
        return 0;
    }

    // Check endinanness
    position = m_EndianFlagPosition;
    const uint8_t endianness = helper::ReadValue<uint8_t>(buffer, position);
    bool IsLittleEndian = (endianness == 0) ? true : false;
    if (helper::IsLittleEndian() != IsLittleEndian)
    {
        std::string m = (IsLittleEndian ? "Little" : "Big");

        helper::Throw<std::runtime_error>("Engine", "BP5Writer", "CountStepsInMetadataIndex",
                                          "ADIOS2 BP5 Engine only supports appending with the same "
                                          "endianness. The existing file is " +
                                              m + "Endian");
    }

    // BP version
    position = m_BPVersionPosition;
    uint8_t Version = helper::ReadValue<uint8_t>(buffer, position, IsLittleEndian);
    if (Version != 5)
    {
        helper::Throw<std::runtime_error>("Engine", "BP5Writer", "CountStepsInMetadataIndex",
                                          "ADIOS2 BP5 Engine only supports bp format "
                                          "version 5, found " +
                                              std::to_string(Version) + " version");
    }

    // BP minor version
    position = m_BPMinorVersionPosition;
    uint8_t minorVersion = helper::ReadValue<uint8_t>(buffer, position, IsLittleEndian);
    if (minorVersion != m_BP5MinorVersion)
    {
        helper::Throw<std::runtime_error>(
            "Engine", "BP5Writer", "CountStepsInMetadataIndex",
            "Current ADIOS2 BP5 Engine can only append to bp format 5." +
                std::to_string(m_BP5MinorVersion) + " but this file is 5." +
                std::to_string(minorVersion) + " version");
    }

    position = m_ColumnMajorFlagPosition;
    const uint8_t columnMajor = helper::ReadValue<uint8_t>(buffer, position, IsLittleEndian);
    const uint8_t NowColumnMajor = (m_IO.m_ArrayOrder == ArrayOrdering::ColumnMajor) ? 'y' : 'n';
    if (columnMajor != NowColumnMajor)
    {
        std::string m = (columnMajor == 'y' ? "column" : "row");
        helper::Throw<std::runtime_error>("Engine", "BP5Writer", "CountStepsInMetadataIndex",
                                          "ADIOS2 BP5 Engine only supports appending with the same "
                                          "column/row major settings as it was written."
                                          " Existing file is " +
                                              m + " major");
    }

    position = m_IndexHeaderSize; // after the header
    // Just count the steps first
    unsigned int availableSteps = 0;
    uint64_t nDataFiles = 0;
    while (position < buffer.size())
    {
        const unsigned char recordID =
            helper::ReadValue<unsigned char>(buffer, position, IsLittleEndian);
        position += sizeof(uint64_t); // recordLength

        switch (recordID)
        {
        case IndexRecord::WriterMapRecord: {
            m_AppendWriterCount =
                (uint32_t)helper::ReadValue<uint64_t>(buffer, position, IsLittleEndian);
            m_AppendAggregatorCount =
                (uint32_t)helper::ReadValue<uint64_t>(buffer, position, IsLittleEndian);
            m_AppendSubfileCount =
                (uint32_t)helper::ReadValue<uint64_t>(buffer, position, IsLittleEndian);
            if (m_AppendSubfileCount > nDataFiles)
            {
                nDataFiles = m_AppendSubfileCount;
            }
            // jump over writermap
            position += m_AppendWriterCount * sizeof(uint64_t);
            break;
        }
        case IndexRecord::StepRecord: {
            position += 2 * sizeof(uint64_t); // MetadataPos, MetadataSize
            const uint64_t FlushCount =
                helper::ReadValue<uint64_t>(buffer, position, IsLittleEndian);
            // jump over the metadata positions
            position += sizeof(uint64_t) * m_AppendWriterCount * ((2 * FlushCount) + 1);
            availableSteps++;
            break;
        }
        }
    }

    unsigned int targetStep = 0;

    if (m_Parameters.AppendAfterSteps < 0)
    {
        // -1 means append after last step
        int s = (int)availableSteps + m_Parameters.AppendAfterSteps + 1;
        if (s < 0)
        {
            s = 0;
        }
        targetStep = static_cast<unsigned int>(s);
    }
    else
    {
        targetStep = static_cast<unsigned int>(m_Parameters.AppendAfterSteps);
    }
    if (targetStep > availableSteps)
    {
        targetStep = availableSteps;
    }

    m_AppendDataPos.resize(nDataFiles, 0ULL);

    if (!targetStep)
    {
        // append at 0 is like writing new file
        m_AppendMetadataPos = 0;
        m_AppendMetaMetadataPos = 0;
        m_AppendMetadataIndexPos = 0;
        return 0;
    }

    m_AppendMetadataPos = MaxSizeT; // size of header
    m_AppendMetaMetadataPos = MaxSizeT;
    m_AppendMetadataIndexPos = MaxSizeT;
    std::fill(m_AppendDataPos.begin(), m_AppendDataPos.end(), MaxSizeT);

    if (targetStep == availableSteps)
    {
        // append after existing steps
        return targetStep;
    }

    // append but not at 0 and not after existing steps
    // Read each record now completely to get offsets at step+1
    position = m_IndexHeaderSize;
    unsigned int currentStep = 0;
    std::vector<uint64_t> writerToFileMap;
    // reading one step beyond target to get correct offsets
    while (currentStep <= targetStep && position < buffer.size())
    {
        const unsigned char recordID =
            helper::ReadValue<unsigned char>(buffer, position, IsLittleEndian);
        position += sizeof(uint64_t); // recordLength

        switch (recordID)
        {
        case IndexRecord::WriterMapRecord: {
            m_AppendWriterCount =
                (uint32_t)helper::ReadValue<uint64_t>(buffer, position, IsLittleEndian);
            m_AppendAggregatorCount =
                (uint32_t)helper::ReadValue<uint64_t>(buffer, position, IsLittleEndian);
            m_AppendSubfileCount =
                (uint32_t)helper::ReadValue<uint64_t>(buffer, position, IsLittleEndian);

            // Get the process -> subfile map
            writerToFileMap.clear();
            for (uint64_t i = 0; i < m_AppendWriterCount; i++)
            {
                const uint64_t subfileIdx =
                    helper::ReadValue<uint64_t>(buffer, position, IsLittleEndian);
                writerToFileMap.push_back(subfileIdx);
            }
            break;
        }
        case IndexRecord::StepRecord: {
            m_AppendMetadataIndexPos =
                position - sizeof(unsigned char) - sizeof(uint64_t); // pos of RecordID
            const uint64_t MetadataPos =
                helper::ReadValue<uint64_t>(buffer, position, IsLittleEndian);
            position += sizeof(uint64_t); // MetadataSize
            const uint64_t FlushCount =
                helper::ReadValue<uint64_t>(buffer, position, IsLittleEndian);

            m_AppendMetadataPos = static_cast<size_t>(MetadataPos);

            if (currentStep == targetStep)
            {
                // we need the very first (smallest) write position to each
                // subfile Offsets and sizes,  2*FlushCount + 1 per writer
                for (uint64_t i = 0; i < m_AppendWriterCount; i++)
                {
                    // first flush/write position will do
                    const size_t FirstDataPos = static_cast<size_t>(
                        helper::ReadValue<uint64_t>(buffer, position, IsLittleEndian));
                    position += sizeof(uint64_t) * 2 * FlushCount; // no need to read
                    /* std::cout << "Writer " << i << " subfile " <<
                       writerToFileMap[i]  << "  first data loc:" <<
                       FirstDataPos << std::endl; */
                    if (FirstDataPos < m_AppendDataPos[writerToFileMap[i]])
                    {
                        m_AppendDataPos[writerToFileMap[i]] = FirstDataPos;
                    }
                }
            }
            else
            {
                // jump over all data offsets in this step
                position += sizeof(uint64_t) * m_AppendWriterCount * (1 + 2 * FlushCount);
            }
            currentStep++;
            break;
        }
        }
    }
    return targetStep;
}